

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<0,_8,_8>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  undefined4 in_register_00000014;
  ShaderEvalContext *extraout_RDX;
  ShaderEvalContext *extraout_RDX_00;
  ShaderEvalContext *evalCtx_00;
  Type in1;
  Type in0;
  Mat3x2 MStack_88;
  Mat3x2 local_70;
  Vector<float,_3> local_58;
  Matrix<float,_2,_3> local_48;
  VecAccess<float,_4,_3> local_30;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,8>
              (&local_70,(MatrixCaseUtils *)evalCtx,
               (ShaderEvalContext *)CONCAT44(in_register_00000014,in1Type),in_ECX);
    evalCtx_00 = extraout_RDX;
  }
  else {
    tcu::Matrix<float,_2,_3>::Matrix(&local_70,(float *)sr::(anonymous_namespace)::s_constInMat3x2);
    evalCtx_00 = extraout_RDX_00;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,8>
              (&MStack_88,(MatrixCaseUtils *)evalCtx,evalCtx_00,in_ECX);
  }
  else {
    tcu::Matrix<float,_2,_3>::Matrix
              (&MStack_88,(float *)(sr::(anonymous_namespace)::s_constInMat3x2 + 0x18));
  }
  tcu::operator+(&local_48,&local_70,&MStack_88);
  local_58.m_data[2] = local_48.m_data.m_data[2].m_data[0] + local_48.m_data.m_data[2].m_data[1];
  local_58.m_data[1] = local_48.m_data.m_data[1].m_data[1] + local_48.m_data.m_data[1].m_data[0];
  local_58.m_data[0] = local_48.m_data.m_data[0].m_data[0] + local_48.m_data.m_data[0].m_data[1];
  local_30.m_vector = &evalCtx->color;
  local_30.m_index[0] = 0;
  local_30.m_index[1] = 1;
  local_30.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_30,&local_58);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 + in1);
	}